

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::web_peer_connection::incoming_payload(web_peer_connection *this,char *buf,int len)

{
  char *__src;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  int *piVar4;
  char *pcVar5;
  unsigned_long __n;
  long lVar6;
  int local_34;
  int local_30;
  int local_2c;
  int copy_size;
  int piece_size;
  peer_request *front_request;
  char *pcStack_18;
  int len_local;
  char *buf_local;
  web_peer_connection *this_local;
  
  front_request._4_4_ = len;
  pcStack_18 = buf;
  buf_local = (char *)this;
  peer_connection::received_bytes((peer_connection *)this,len,0);
  this->m_received_body = front_request._4_4_ + this->m_received_body;
  uVar2 = (*(this->super_web_connection_base).super_peer_connection.super_bandwidth_socket.
            _vptr_bandwidth_socket[1])();
  if ((uVar2 & 1) == 0) {
    peer_connection::peer_log
              ((peer_connection *)this,incoming_message,"INCOMING_PAYLOAD","%d bytes",
               (ulong)front_request._4_4_);
    while ((0 < (int)front_request._4_4_ &&
           (bVar1 = ::std::
                    deque<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>::
                    empty(&(this->super_web_connection_base).m_requests), !bVar1))) {
      _copy_size = ::std::deque<libtorrent::peer_request,_std::allocator<libtorrent::peer_request>_>
                   ::front(&(this->super_web_connection_base).m_requests);
      sVar3 = ::std::vector<char,_std::allocator<char>_>::size
                        (&(this->m_piece).super_vector<char,_std::allocator<char>_>);
      local_2c = (int)sVar3;
      local_34 = _copy_size->length - local_2c;
      piVar4 = ::std::min<int>(&local_34,(int *)((long)&front_request + 4));
      local_30 = *piVar4;
      container_wrapper<char,int,std::vector<char,std::allocator<char>>>::resize<int,void>
                ((container_wrapper<char,int,std::vector<char,std::allocator<char>>> *)
                 &this->m_piece,local_2c + local_30);
      pcVar5 = ::std::vector<char,_std::allocator<char>_>::data
                         (&(this->m_piece).super_vector<char,_std::allocator<char>_>);
      __src = pcStack_18;
      lVar6 = (long)local_2c;
      __n = numeric_cast<unsigned_long,int,void>(local_30);
      memcpy(pcVar5 + lVar6,__src,__n);
      front_request._4_4_ = front_request._4_4_ - local_30;
      pcStack_18 = pcStack_18 + local_30;
      peer_connection::incoming_piece_fragment((peer_connection *)this,local_30);
      maybe_harvest_piece(this);
    }
  }
  return;
}

Assistant:

void web_peer_connection::incoming_payload(char const* buf, int len)
{
	received_bytes(len, 0);
	m_received_body += len;

	if (is_disconnecting()) return;

#ifndef TORRENT_DISABLE_LOGGING
	peer_log(peer_log_alert::incoming_message, "INCOMING_PAYLOAD", "%d bytes", len);
#endif

	// deliver all complete bittorrent requests to the bittorrent engine
	while (len > 0)
	{
		if (m_requests.empty())
		{
			TORRENT_ASSERT(m_piece.empty());
			return;
		}

		TORRENT_ASSERT(!m_requests.empty());
		peer_request const& front_request = m_requests.front();
		int const piece_size = int(m_piece.size());
		int const copy_size = std::min(front_request.length - piece_size, len);

		// m_piece may not hold more than the response to the next BT request
		TORRENT_ASSERT(front_request.length > piece_size);
		TORRENT_ASSERT(int(m_piece.size()) == m_received_in_piece);

		// copy_size is the number of bytes we need to add to the end of m_piece
		// to not exceed the size of the next bittorrent request to be delivered.
		// m_piece can only hold the response for a single BT request at a time
		m_piece.resize(piece_size + copy_size);
		std::memcpy(m_piece.data() + piece_size, buf, aux::numeric_cast<std::size_t>(copy_size));
		len -= copy_size;
		buf += copy_size;

		// keep peer stats up-to-date
		incoming_piece_fragment(copy_size);

		TORRENT_ASSERT(front_request.length >= piece_size);
		maybe_harvest_piece();
	}
}